

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_int8.h
# Opt level: O0

void ncnn::compute_B_fp32_int8_scale(Mat *B,float *scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  float *pfVar5;
  float *in_RSI;
  long *in_RDI;
  undefined1 auVar6 [32];
  __m128 _p_1;
  __m256 _p;
  int j;
  int size;
  float *ptr;
  int B_hstep;
  int i;
  __m128 _absmax;
  __m256 _absmax_avx;
  float absmax;
  __m256 abs_mask;
  __m128 abs_mask_1;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m128 x32_1;
  __m128 x64_1;
  float local_510;
  int local_508;
  int local_504;
  float local_4fc;
  float local_4f8;
  float local_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  int local_4a8;
  int local_4a4;
  undefined1 (*local_4a0) [32];
  int local_498;
  int local_494;
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  float local_44c;
  float *local_448;
  long *local_440;
  long *local_438;
  undefined1 (*local_430) [32];
  undefined1 (*local_428) [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined1 local_290 [16];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined4 local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [16];
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_44c = 0.0;
  local_420 = 0;
  uStack_418 = 0;
  uStack_410 = 0;
  uStack_408 = 0;
  local_480 = ZEXT1632(ZEXT816(0));
  local_490 = ZEXT816(0) << 0x20;
  local_494 = 0;
  local_448 = in_RSI;
  local_440 = in_RDI;
  local_3f0 = local_490;
  while( true ) {
    if ((int)local_440[5] == 3) {
      local_504 = (int)local_440[7];
    }
    else {
      local_504 = (int)local_440[6];
    }
    if (local_504 <= local_494) break;
    if ((int)local_440[5] == 3) {
      local_508 = (int)local_440[8];
    }
    else {
      local_508 = *(int *)((long)local_440 + 0x2c);
    }
    local_498 = local_508;
    local_438 = local_440;
    local_4a0 = (undefined1 (*) [32])
                (*local_440 + (long)(local_494 * local_508 * (int)local_440[3]) * 4);
    local_4a4 = *(int *)((long)local_440 + 0x2c) * (int)local_440[3];
    for (local_4a8 = 0; local_4a8 + 7 < local_4a4; local_4a8 = local_4a8 + 8) {
      local_430 = local_4a0;
      local_4e0 = *(undefined8 *)*local_4a0;
      uStack_4d8 = *(undefined8 *)(*local_4a0 + 8);
      uStack_4d0 = *(undefined8 *)(*local_4a0 + 0x10);
      uStack_4c8 = *(undefined8 *)(*local_4a0 + 0x18);
      local_3c0 = local_480._0_8_;
      uStack_3b8 = local_480._8_8_;
      uStack_3b0 = local_480._16_8_;
      uStack_3a8 = local_480._24_8_;
      local_1a4 = 0x7fffffff;
      local_140 = 0x7fffffff;
      auVar1 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar1 = vpinsrd_avx(auVar1,0x7fffffff,2);
      auVar1 = vpinsrd_avx(auVar1,0x7fffffff,3);
      auVar2 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar2 = vpinsrd_avx(auVar2,0x7fffffff,2);
      auVar2 = vpinsrd_avx(auVar2,0x7fffffff,3);
      auVar6._16_16_ = auVar1;
      auVar6._0_16_ = auVar2;
      local_160._0_8_ = auVar2._0_8_;
      local_1e0 = local_160._0_8_;
      local_160._8_8_ = auVar2._8_8_;
      uStack_1d8 = local_160._8_8_;
      local_160._16_8_ = auVar1._0_8_;
      uStack_1d0 = local_160._16_8_;
      local_160._24_8_ = auVar1._8_8_;
      uStack_1c8 = local_160._24_8_;
      local_3a0 = local_160._0_8_;
      uStack_398 = local_160._8_8_;
      uStack_390 = local_160._16_8_;
      uStack_388 = local_160._24_8_;
      local_180 = local_160._0_8_;
      uStack_178 = local_160._8_8_;
      uStack_170 = local_160._16_8_;
      uStack_168 = local_160._24_8_;
      auVar3._16_8_ = local_160._16_8_;
      auVar3._0_16_ = auVar2;
      auVar3._24_8_ = local_160._24_8_;
      local_3e0 = vandps_avx(auVar3,*local_4a0);
      local_480 = vmaxps_avx(local_480,local_3e0);
      local_4a0 = local_4a0 + 1;
      local_380 = local_4e0;
      uStack_378 = uStack_4d8;
      uStack_370 = uStack_4d0;
      uStack_368 = uStack_4c8;
      local_1a0 = local_4e0;
      uStack_198 = uStack_4d8;
      uStack_190 = uStack_4d0;
      uStack_188 = uStack_4c8;
      local_160 = auVar6;
      local_13c = local_140;
      local_138 = local_140;
      local_134 = local_140;
      local_130 = local_140;
      local_12c = local_140;
      local_128 = local_140;
      local_124 = local_140;
    }
    for (; local_4a8 + 3 < local_4a4; local_4a8 = local_4a8 + 4) {
      local_428 = local_4a0;
      local_4f0 = *(undefined8 *)*local_4a0;
      uStack_4e8 = *(undefined8 *)(*local_4a0 + 8);
      local_340 = local_490._0_8_;
      uStack_338 = local_490._8_8_;
      local_104 = 0x7fffffff;
      local_d0 = 0x7fffffff;
      auVar1 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar1 = vpinsrd_avx(auVar1,0x7fffffff,2);
      local_e0 = vpinsrd_avx(auVar1,0x7fffffff,3);
      local_120 = local_e0._0_8_;
      uStack_118 = local_e0._8_8_;
      local_330 = local_e0._0_8_;
      uStack_328 = local_e0._8_8_;
      local_f0 = local_e0._0_8_;
      uStack_e8 = local_e0._8_8_;
      local_350 = vpand_avx(local_e0,*(undefined1 (*) [16])*local_4a0);
      local_490 = vmaxps_avx(local_490,local_350);
      local_4a0 = (undefined1 (*) [32])(*local_4a0 + 0x10);
      local_320 = local_4f0;
      uStack_318 = uStack_4e8;
      local_100 = local_4f0;
      uStack_f8 = uStack_4e8;
      local_cc = local_d0;
      local_c8 = local_d0;
      local_c4 = local_d0;
    }
    for (; local_4a8 < local_4a4; local_4a8 = local_4a8 + 1) {
      auVar1 = vpand_avx(ZEXT416(*(uint *)*local_4a0),_DAT_01f9d040);
      local_4f4 = auVar1._0_4_;
      pfVar5 = std::max<float>(&local_44c,&local_4f4);
      local_44c = *pfVar5;
      local_4a0 = (undefined1 (*) [32])(*local_4a0 + 4);
    }
    local_494 = local_494 + 1;
  }
  local_2e0 = local_480._0_8_;
  uStack_2d8 = local_480._8_8_;
  uStack_2d0 = local_480._16_8_;
  uStack_2c8 = local_480._24_8_;
  local_c0 = local_480._0_8_;
  uStack_b8 = local_480._8_8_;
  uStack_b0 = local_480._16_8_;
  uStack_a8 = local_480._24_8_;
  local_260 = local_480._16_8_;
  uStack_258 = local_480._24_8_;
  local_270 = local_480._0_8_;
  uStack_268 = local_480._8_8_;
  local_2f0 = vmaxps_avx(local_480._16_16_,local_480._0_16_);
  local_2a0 = local_2f0._0_8_;
  uStack_298 = local_2f0._8_8_;
  local_2b0 = local_2f0._0_8_;
  uStack_2a8 = local_2f0._8_8_;
  local_290 = vunpckhpd_avx(local_2f0,local_2f0);
  local_280 = local_2f0._0_8_;
  uStack_278 = local_2f0._8_8_;
  local_300 = vmaxps_avx(local_2f0,local_290);
  local_60 = local_300._0_8_;
  uStack_58 = local_300._8_8_;
  local_70 = local_300._4_4_;
  uStack_6c = local_300._4_4_;
  uStack_68 = local_300._4_4_;
  uStack_64 = local_300._4_4_;
  auVar2._4_4_ = local_300._4_4_;
  auVar2._0_4_ = local_300._4_4_;
  auVar2._8_4_ = local_300._4_4_;
  auVar2._12_4_ = local_300._4_4_;
  local_310 = vmaxss_avx(local_300,auVar2);
  local_40 = local_310._0_8_;
  uVar4 = local_40;
  uStack_38 = local_310._8_8_;
  local_40._0_4_ = local_310._0_4_;
  local_4f8 = (float)local_40;
  local_40 = uVar4;
  pfVar5 = std::max<float>(&local_44c,&local_4f8);
  local_44c = *pfVar5;
  local_230 = local_490._0_8_;
  uStack_228 = local_490._8_8_;
  local_210 = local_490._0_8_;
  uStack_208 = local_490._8_8_;
  local_220 = local_490._0_8_;
  uStack_218 = local_490._8_8_;
  local_200 = vunpckhpd_avx(local_490,local_490);
  local_1f0 = local_490._0_8_;
  uStack_1e8 = local_490._8_8_;
  local_240 = vmaxps_avx(local_490,local_200);
  local_80 = local_240._0_8_;
  uStack_78 = local_240._8_8_;
  local_90 = local_240._4_4_;
  uStack_8c = local_240._4_4_;
  uStack_88 = local_240._4_4_;
  uStack_84 = local_240._4_4_;
  auVar1._4_4_ = local_240._4_4_;
  auVar1._0_4_ = local_240._4_4_;
  auVar1._8_4_ = local_240._4_4_;
  auVar1._12_4_ = local_240._4_4_;
  local_250 = vmaxss_avx(local_240,auVar1);
  local_50 = local_250._0_8_;
  uVar4 = local_50;
  uStack_48 = local_250._8_8_;
  local_50._0_4_ = local_250._0_4_;
  local_4fc = (float)local_50;
  local_50 = uVar4;
  pfVar5 = std::max<float>(&local_44c,&local_4fc);
  local_510 = *pfVar5;
  if ((local_510 != 0.0) || (NAN(local_510))) {
    local_510 = 127.0 / local_510;
  }
  else {
    local_510 = 1.0;
  }
  *local_448 = local_510;
  return;
}

Assistant:

static void compute_B_fp32_int8_scale(const Mat& B, float& scale)
{
    // NCNN_LOGE("compute_B_fp32_int8_scale");

    float absmax = 0.f;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _absmax_avx512 = _mm512_setzero_ps();
#endif // __AVX512F__
    __m256 _absmax_avx = _mm256_setzero_ps();
#endif // __AVX__
    __m128 _absmax = _mm_setzero_ps();
#endif // __SSE2__
    for (int i = 0; i < (B.dims == 3 ? B.c : B.h); i++)
    {
        const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;
        const float* ptr = (const float*)B + i * B_hstep * B.elempack;

        const int size = B.w * B.elempack;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; j + 15 < size; j += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _absmax_avx512 = _mm512_max_ps(_absmax_avx512, abs512_ps(_p));
            ptr += 16;
        }
#endif // __AVX512F__
        for (; j + 7 < size; j += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _absmax_avx = _mm256_max_ps(_absmax_avx, abs256_ps(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; j + 3 < size; j += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _absmax = _mm_max_ps(_absmax, abs_ps(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; j < size; j++)
        {
            absmax = std::max(absmax, (float)fabsf(ptr[0]));
            ptr++;
        }
    }
#if __SSE2__
#if __AVX__
#if __AVX512F__
    absmax = std::max(absmax, _mm512_comp_reduce_max_ps(_absmax_avx512));
#endif // __AVX512F__
    absmax = std::max(absmax, _mm256_reduce_max_ps(_absmax_avx));
#endif // __AVX__
    absmax = std::max(absmax, _mm_reduce_max_ps(_absmax));
#endif

    scale = absmax == 0.f ? 1.f : 127.f / absmax;
}